

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

float Lf_CutDeref_rec(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Jf_Par_t *pJVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  word CutTemp [10];
  Lf_Cut_t local_78;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.iFunc = 0;
  local_78._20_4_ = 0;
  uStack_60 = 0;
  local_78.Sign = 0;
  local_78.Delay = 0;
  local_78.Flow = 0.0;
  uVar2 = *(uint *)&pCut->field_0x14;
  fVar7 = 0.0;
  if ((uVar2 >> 0x17 & 1) == 0 && 0x1ffffff < uVar2) {
    uVar5 = uVar2 >> 0x18;
    pJVar4 = p->pPars;
    if (pJVar4->fPower == 0) {
      if (pJVar4->fOptEdge == 0) {
        fVar7 = 1.0;
      }
      else {
        fVar7 = (float)(int)(uVar5 + pJVar4->nAreaTuner);
      }
      goto LAB_006d6ceb;
    }
    fVar7 = 0.0;
    uVar6 = 0;
    do {
      iVar3 = *(int *)((long)&pCut[1].Sign + uVar6 * 4);
      if (((long)iVar3 < 0) || ((p->vSwitches).nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar7 = fVar7 + (p->vSwitches).pArray[iVar3];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    fVar7 = (float)uVar5 + fVar7;
  }
  if (uVar2 < 0x1000000) {
    return fVar7;
  }
LAB_006d6ceb:
  uVar6 = 0;
  do {
    uVar2 = *(uint *)((long)&pCut[1].Sign + uVar6 * 4);
    if ((ulong)uVar2 == 0) {
      return fVar7;
    }
    if (((int)uVar2 < 0) || ((p->vOffsets).nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = (p->vOffsets).pArray[uVar2];
    if (-1 < (long)iVar3) {
      if ((p->vMapRefs).nSize <= iVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar1 = (p->vMapRefs).pArray + iVar3;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Lf_ObjCutBestNew(p,uVar2,&local_78);
        fVar8 = Lf_CutDeref_rec(p,&local_78);
        fVar7 = fVar7 + fVar8;
      }
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 < (byte)pCut->field_0x17);
  return fVar7;
}

Assistant:

float Lf_CutDeref_rec( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    word CutTemp[LF_CUT_WORDS] = {0};
    float Count = Lf_CutArea(p, pCut);
    int i, Var; 
    Lf_CutForEachVar( pCut, Var, i )
        if ( !Lf_ObjMapRefDec(p, Var) )
            Count += Lf_CutDeref_rec( p, Lf_ObjCutBestNew(p, Var, (Lf_Cut_t *)CutTemp) );
    return Count;
}